

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O0

void __thiscall
duckdb::BaseAppender::AppendValueInternal<float,unsigned_long>
          (BaseAppender *this,Vector *col,float input)

{
  unsigned_long uVar1;
  unsigned_long *puVar2;
  idx_t iVar3;
  long in_RDI;
  float unaff_retaddr;
  
  uVar1 = Cast::Operation<float,unsigned_long>(unaff_retaddr);
  puVar2 = FlatVector::GetData<unsigned_long>((Vector *)0x946eb8);
  iVar3 = DataChunk::size((DataChunk *)(in_RDI + 0x48));
  puVar2[iVar3] = uVar1;
  return;
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}